

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_allreduce_qtree_single
          (bsc_step_t depends,bsc_group_t group,void *src,void *dst,void *tmp_space,
          bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size,bsc_pid_t q)

{
  long lVar1;
  bsp_pid_t bVar2;
  int iVar3;
  int iVar4;
  void *dst_00;
  bsc_pid_t src_pid;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 local_5c;
  
  if (group == (bsc_group_t)0x0) {
    iVar3 = bsp_nprocs();
    iVar4 = bsp_pid();
  }
  else {
    iVar3 = *group;
    lVar1 = *(long *)((long)group + 8);
    bVar2 = bsp_pid();
    iVar4 = *(int *)(lVar1 + (long)bVar2 * 4);
  }
  dst_00 = (void *)((long)size + (long)tmp_space);
  pvVar5 = tmp_space;
  if (iVar3 == 1) {
    pvVar5 = dst;
  }
  (*reducer)(pvVar5,zero,src,nmemb * size);
  iVar6 = 1;
  local_5c = depends;
  while (iVar6 < iVar3) {
    iVar7 = 1;
    iVar8 = 1;
    iVar9 = iVar6;
    while( true ) {
      if (q <= iVar7) break;
      if (iVar9 < iVar3) {
        src_pid = (iVar4 + iVar9) % iVar3;
        if (group != (bsc_group_t)0x0) {
          src_pid = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)src_pid * 4);
        }
        bsc_get(local_5c,src_pid,tmp_space,0,(void *)((long)(iVar8 * size) + (long)dst_00),size);
        iVar8 = iVar8 + 1;
      }
      iVar7 = iVar7 + 1;
      iVar9 = iVar9 + iVar6;
    }
    bVar2 = bsp_pid();
    bsc_get(local_5c,bVar2,tmp_space,0,dst_00,size);
    iVar6 = iVar6 * q;
    pvVar5 = dst;
    if (iVar6 < iVar3) {
      pvVar5 = tmp_space;
    }
    bsc_exec_reduce(local_5c,reducer,pvVar5,zero,dst_00,iVar8 * size);
    local_5c = local_5c + 1;
  }
  return local_5c;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_allreduce_qtree_single( 
        bsc_step_t depends, bsc_group_t group,
        const void * src, void * dst, void * tmp_space,
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size, 
        bsc_pid_t q )
{
    const group_t * g = group;
    bsc_pid_t i, j, k, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, s = g?g->lid[bsp_pid()]:bsp_pid();
    char * tmp_bytes = tmp_space;
    void * accum = tmp_bytes;
    char * gather = tmp_bytes + size;

    (*reducer)( P==1?dst:accum, zero, src, size * nmemb );

    for (range = 1; range < P; range *= q ) {
        k = 1;
        for ( i = 1 ; i < q; ++i) {
            if (i * range < P) {
                j = (i * range + s)%P; 
                bsc_get( depends, g?g->gid[j]:j, accum, 0,
                        &gather[k * size], size);
                k+=1;
            }
        }
        bsc_get( depends, bsp_pid(), accum, 0, gather, size );
        bsc_exec_reduce( depends, reducer, range*q>=P?dst:accum, zero, gather, size*k );
        depends += 1;
    }
    return depends;
}